

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O2

void re2::SetEmptyUnanchored(void)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> v;
  Set s;
  LogMessageFatal local_190;
  
  RE2::Options::Options((Options *)&local_190,DefaultOptions);
  RE2::Set::Set(&s,(Options *)&local_190,UNANCHORED);
  bVar1 = RE2::Set::Compile(&s);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7c);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_190.super_LogMessage._0_8_ = "";
  local_190.super_LogMessage._8_4_ = 0;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7e);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_190.super_LogMessage._0_8_ = "foobar";
  local_190.super_LogMessage._8_4_ = 6;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7f);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foobar\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_190.super_LogMessage._0_8_ = "";
  local_190.super_LogMessage._8_4_ = 0;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,&v);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x82);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x83);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_190.super_LogMessage._0_8_ = "foobar";
  local_190.super_LogMessage._8_4_ = 6;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_190,&v);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x85);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foobar\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x86);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  RE2::Set::~Set(&s);
  return;
}

Assistant:

TEST(Set, EmptyUnanchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("", NULL), false);
  CHECK_EQ(s.Match("foobar", NULL), false);

  vector<int> v;
  CHECK_EQ(s.Match("", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("foobar", &v), false);
  CHECK_EQ(v.size(), 0);
}